

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O0

void print_usage(char *prg)

{
  undefined8 in_RDI;
  char manual [1912];
  undefined1 auStack_788 [1920];
  undefined8 local_8;
  
  local_8 = in_RDI;
  memcpy(auStack_788,
         "commands that can be entered at runtime:\n q<ENTER>        - quit\n b<ENTER>        - toggle binary / HEX-ASCII output\n 8<ENTER>        - toggle binary / HEX-ASCII output (small for EFF on 80 chars)\n B<ENTER>        - toggle binary with gap / HEX-ASCII output (exceeds 80 chars!)\n c<ENTER>        - toggle color mode\n @<ENTER>        - toggle ASCII output (disabled for CAN FD by default)\n <SPACE><ENTER>  - force a clear screen\n #<ENTER>        - notch currently marked/changed bits (can be used repeatedly)\n *<ENTER>        - clear notched marked\n rMYNAME<ENTER>  - read settings file (filter/notch)\n wMYNAME<ENTER>  - write settings file (filter/notch)\n a<ENTER>        - enable \'a\'ll SFF CAN-IDs to sniff\n n<ENTER>        - enable \'n\'one SFF CAN-IDs to sniff\n A<ENTER>        - enable \'A\'ll EFF CAN-IDs to sniff\n N<ENTER>        - enable \'N\'one EFF CAN-IDs to sniff\n +FILTER<ENTER>  - add CAN-IDs to sniff\n -FILTER<ENTER>  - remove CAN-IDs to sniff\n\nFILTER can be a single CAN-ID or a CAN-ID/Bitmask:\n\n single SFF 11 bit IDs:\n  +1F5<ENTER>               - add SFF CAN-ID 0x1F5\n  -42E<ENTER>               - remove SFF CAN-ID 0x42E\n\n single EFF 29 bit IDs:\n  +18FEDF55<ENTER>          - add EFF CAN-ID 0x18FEDF55\n  -00000090<ENTER>          - remove EFF CAN-ID 0x00000090\n\n CAN-ID/Bitmask SFF:\n  -42E7FF<ENTER>            - remove SFF CAN-ID 0x42E (using Bitmask)\n  -500700<ENTER>            - remove SFF CAN-IDs 0x500 - 0x5FF\n  +400600<ENTER>            - add SFF CAN-IDs 0x400 - 0x5FF\n  +000000<ENTER>            - add all SFF CAN-IDs\n  -000000<ENTER>            - remove all SFF CAN-IDs\n\n CAN-ID/Bitmask EFF:\n  -0000000000000000<ENTER>  - remove all EFF CAN-IDs\n  +12345678000000FF<ENTER>  - add EFF CAN IDs xxxxxx78\n  +0000000000000000<ENTER>  - add all EFF CAN-IDs\n\nif (id & filter) == (sniff-id & filter) the action (+/-) is performed,\nwhich is quite easy when the filter is 000 resp. 00000000 for EFF.\n\n"
         ,0x778);
  fprintf(_stderr,"%s - volatile CAN content visualizer.\n",local_8);
  fprintf(_stderr,"\nUsage: %s [can-interface]\n",local_8);
  fprintf(_stderr,"Options:\n");
  fprintf(_stderr,"         -q          (quiet - all IDs deactivated)\n");
  fprintf(_stderr,"         -r <name>   (read %sname from file)\n","sniffset.");
  fprintf(_stderr,"         -e          (fix extended frame format output - no auto detect)\n");
  fprintf(_stderr,"         -b          (start with binary mode)\n");
  fprintf(_stderr,"         -8          (start with binary mode - for EFF on 80 chars)\n");
  fprintf(_stderr,"         -B          (start with binary mode with gap - exceeds 80 chars!)\n");
  fprintf(_stderr,"         -c          (color changes)\n");
  fprintf(_stderr,
          "         -f <mode>   (CAN FD mode: 0 = OFF, 1 = ON, 2 = auto detect, default: %d)\n",2);
  fprintf(_stderr,"         -t <time>   (timeout for ID display [x10ms] default: %d, 0 = OFF)\n",500
         );
  fprintf(_stderr,"         -h <time>   (hold marker on changes [x10ms] default: %d)\n",100);
  fprintf(_stderr,"         -l <time>   (loop time (display) [x10ms] default: %d)\n",0x14);
  fprintf(_stderr,"         -?          (print this help text)\n");
  fprintf(_stderr,"Use interface name \'%s\' to receive from all can-interfaces.\n","any");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"%s",auStack_788);
  return;
}

Assistant:

void print_usage(char *prg)
{
	const char manual [] = {
		"commands that can be entered at runtime:\n"
		" q<ENTER>        - quit\n"
		" b<ENTER>        - toggle binary / HEX-ASCII output\n"
		" 8<ENTER>        - toggle binary / HEX-ASCII output (small for EFF on 80 chars)\n"
		" B<ENTER>        - toggle binary with gap / HEX-ASCII output (exceeds 80 chars!)\n"
		" c<ENTER>        - toggle color mode\n"
		" @<ENTER>        - toggle ASCII output (disabled for CAN FD by default)\n"
		" <SPACE><ENTER>  - force a clear screen\n"
		" #<ENTER>        - notch currently marked/changed bits (can be used repeatedly)\n"
		" *<ENTER>        - clear notched marked\n"
		" rMYNAME<ENTER>  - read settings file (filter/notch)\n"
		" wMYNAME<ENTER>  - write settings file (filter/notch)\n"
		" a<ENTER>        - enable 'a'll SFF CAN-IDs to sniff\n"
		" n<ENTER>        - enable 'n'one SFF CAN-IDs to sniff\n"
		" A<ENTER>        - enable 'A'll EFF CAN-IDs to sniff\n"
		" N<ENTER>        - enable 'N'one EFF CAN-IDs to sniff\n"
		" +FILTER<ENTER>  - add CAN-IDs to sniff\n"
		" -FILTER<ENTER>  - remove CAN-IDs to sniff\n"
		"\n"
		"FILTER can be a single CAN-ID or a CAN-ID/Bitmask:\n"
		"\n"
		" single SFF 11 bit IDs:\n"
		"  +1F5<ENTER>               - add SFF CAN-ID 0x1F5\n"
		"  -42E<ENTER>               - remove SFF CAN-ID 0x42E\n"
		"\n"
		" single EFF 29 bit IDs:\n"
		"  +18FEDF55<ENTER>          - add EFF CAN-ID 0x18FEDF55\n"
		"  -00000090<ENTER>          - remove EFF CAN-ID 0x00000090\n"
		"\n"
		" CAN-ID/Bitmask SFF:\n"
		"  -42E7FF<ENTER>            - remove SFF CAN-ID 0x42E (using Bitmask)\n"
		"  -500700<ENTER>            - remove SFF CAN-IDs 0x500 - 0x5FF\n"
		"  +400600<ENTER>            - add SFF CAN-IDs 0x400 - 0x5FF\n"
		"  +000000<ENTER>            - add all SFF CAN-IDs\n"
		"  -000000<ENTER>            - remove all SFF CAN-IDs\n"
		"\n"
		" CAN-ID/Bitmask EFF:\n"
		"  -0000000000000000<ENTER>  - remove all EFF CAN-IDs\n"
		"  +12345678000000FF<ENTER>  - add EFF CAN IDs xxxxxx78\n"
		"  +0000000000000000<ENTER>  - add all EFF CAN-IDs\n"
		"\n"
		"if (id & filter) == (sniff-id & filter) the action (+/-) is performed,\n"
		"which is quite easy when the filter is 000 resp. 00000000 for EFF.\n"
		"\n"
	};

	fprintf(stderr, "%s - volatile CAN content visualizer.\n", prg);
	fprintf(stderr, "\nUsage: %s [can-interface]\n", prg);
	fprintf(stderr, "Options:\n");
	fprintf(stderr, "         -q          (quiet - all IDs deactivated)\n");
	fprintf(stderr, "         -r <name>   (read %sname from file)\n", SETFNAME);
	fprintf(stderr, "         -e          (fix extended frame format output - no auto detect)\n");
	fprintf(stderr, "         -b          (start with binary mode)\n");
	fprintf(stderr, "         -8          (start with binary mode - for EFF on 80 chars)\n");
	fprintf(stderr, "         -B          (start with binary mode with gap - exceeds 80 chars!)\n");
	fprintf(stderr, "         -c          (color changes)\n");
	fprintf(stderr, "         -f <mode>   (CAN FD mode: 0 = OFF, 1 = ON, 2 = auto detect, default: %d)\n", CANFD_AUTO);
	fprintf(stderr, "         -t <time>   (timeout for ID display [x10ms] default: %d, 0 = OFF)\n", TIMEOUT);
	fprintf(stderr, "         -h <time>   (hold marker on changes [x10ms] default: %d)\n", HOLD);
	fprintf(stderr, "         -l <time>   (loop time (display) [x10ms] default: %d)\n", LOOP);
	fprintf(stderr, "         -?          (print this help text)\n");
	fprintf(stderr, "Use interface name '%s' to receive from all can-interfaces.\n", ANYDEV);
	fprintf(stderr, "\n");
	fprintf(stderr, "%s", manual);
}